

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kat.cpp
# Opt level: O2

void kat::DoKatSort(vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> *inFiles)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  code *pcVar6;
  code *pcVar7;
  int iVar8;
  pointer pp_Var9;
  int iVar10;
  size_t sStack_10d0;
  uint local_10ac;
  int offset;
  _func_void_map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>_ptr_fin_data_ptr
  *GetPLTRow;
  map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
  data_plt;
  map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
  data_elt;
  _func_void_map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>_ptr_fin_data_ptr
  *GetELTRow;
  char local_1030 [4096];
  
  data_elt._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data_elt._M_t._M_impl.super__Rb_tree_header._M_header;
  data_elt._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data_elt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data_elt._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data_plt._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data_plt._M_t._M_impl.super__Rb_tree_header._M_header;
  data_plt._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data_plt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pp_Var9 = (inFiles->super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar2 = false;
  iVar8 = 0;
  local_10ac = 0;
  data_plt._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data_plt._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data_elt._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data_elt._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (pp_Var9 ==
        (inFiles->super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar6 = GetRowORD;
      if (bVar2) {
        pcVar6 = GetRowLegacy;
      }
      pcVar7 = GetRowORD;
      if (bVar2) {
        pcVar7 = GetRowLegacy;
      }
      GetPLTRow = pcVar7;
      GetELTRow = pcVar6;
      if (data_elt._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        if (data_plt._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          WriteAndReadRows<std::map<kat::period_event,kat::fin_data,std::less<kat::period_event>,std::allocator<std::pair<kat::period_event_const,kat::fin_data>>>>
                    (&data_plt,&GetPLTRow);
        }
      }
      else {
        WriteAndReadRows<std::map<int,kat::fin_data,std::less<int>,std::allocator<std::pair<int_const,kat::fin_data>>>>
                  (&data_elt,&GetELTRow);
      }
      std::
      _Rb_tree<kat::period_event,_std::pair<const_kat::period_event,_kat::fin_data>,_std::_Select1st<std::pair<const_kat::period_event,_kat::fin_data>_>,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
      ::~_Rb_tree(&data_plt._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_kat::fin_data>,_std::_Select1st<std::pair<const_int,_kat::fin_data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>
      ::~_Rb_tree(&data_elt._M_t);
      return;
    }
    while( true ) {
      pcVar5 = fgets(local_1030,0x1000,(FILE *)*pp_Var9);
      if (pcVar5 == (char *)0x0) goto LAB_0010278a;
      GetELTRow = (_func_void_map<int,_kat::fin_data,_std::less<int>,_std::allocator<std::pair<const_int,_kat::fin_data>_>_>_ptr_fin_data_ptr
                   *)*pp_Var9;
      offset = 0;
      iVar3 = __isoc99_sscanf(pcVar5,"%f%n",&GetPLTRow,&offset);
      if (iVar3 != 0) break;
      fputs(pcVar5,_stdout);
    }
    iVar10 = 0;
    while (iVar3 == 1) {
      iVar10 = iVar10 + 1;
      pcVar5 = pcVar5 + offset;
      iVar3 = __isoc99_sscanf(pcVar5,",%f%n",&GetPLTRow,&offset);
    }
    iVar3 = iVar10;
    if ((iVar8 != 0) && (iVar3 = iVar8, iVar8 != iVar10)) {
      pcVar5 = "FATAL: File formats do not match.\n";
      sStack_10d0 = 0x22;
LAB_00102980:
      fwrite(pcVar5,sStack_10d0,1,_stderr);
LAB_00102989:
      exit(1);
    }
    iVar8 = iVar3;
    switch(iVar10) {
    case 4:
    case 5:
      GetRowORD(&data_elt,(fin_data *)&GetELTRow);
      break;
    case 6:
      bVar2 = true;
      GetRowLegacy(&data_elt,(fin_data *)&GetELTRow);
      break;
    default:
      fprintf(_stderr,"FATAL: Unknown file format:\n%s",local_1030);
      goto LAB_00102989;
    case 8:
    case 10:
      bVar2 = true;
      GetRowLegacy(&data_plt,(fin_data *)&GetELTRow);
      break;
    case 0xb:
      bVar1 = CheckQPLT(local_1030);
      if (bVar1) {
        GetRowORD(&data_plt,(fin_data *)&GetELTRow);
        uVar4 = 2;
      }
      else {
        GetRowORD(&data_elt,(fin_data *)&GetELTRow);
        uVar4 = 1;
      }
      local_10ac = local_10ac | uVar4;
      if (local_10ac == 3) {
        pcVar5 = "FATAL: Cannot combine QPLT and MELT files\n";
        sStack_10d0 = 0x2a;
        goto LAB_00102980;
      }
      break;
    case 0xc:
    case 0x11:
      GetRowORD(&data_plt,(fin_data *)&GetELTRow);
    }
LAB_0010278a:
    pp_Var9 = pp_Var9 + 1;
  } while( true );
}

Assistant:

void DoKatSort(std::vector<FILE*>& inFiles) {

		std::map<int, fin_data> data_elt;
		std::map<period_event, fin_data> data_plt;
		int expectedNArgs = 0;
		bool legacyFiles = false;
		// Use these to check that a combination of QPLT and MELT files
		// have not been entered for concatenation
		const int qpltMELTMask = 1 << 1 | 1;   // = 3
		int qpltMELTCheck = 0;

		// Get first line from each file, check for header and
		// determine table type
		for (std::vector<FILE*>::iterator it = inFiles.begin();
		     it != inFiles.end(); ++it) {

			fin_data row;
			int argCheck;
			int inArgs = 0;
			do {

				char *data = fgets(row.data, sizeof(row.data),
						   *it);
				if (data == nullptr) break;   // Empty file
				row.fin = *it;

				float val;
				int offset = 0;
				argCheck = sscanf(data, "%f%n", &val, &offset);
				if (argCheck == 0) {   // Found header
					fprintf(stdout, "%s", data);
					continue;
				}

				// Use number of fields to determine table type
				while (argCheck == 1) {
					inArgs++;
					data += offset;
					argCheck = sscanf(data, ",%f%n", &val,
							  &offset);
				}

				if (expectedNArgs == 0) expectedNArgs = inArgs;
				else if (inArgs != expectedNArgs) {
					fprintf(stderr,
						"FATAL: File formats do not match.\n");
					exit(EXIT_FAILURE);
				}

				switch (inArgs) {
					case number_of_fields::QELT:
					case number_of_fields::SELT:
						GetRowORD(data_elt, row);
						break;
					case number_of_fields::SPLT:
					case number_of_fields::MPLT:
						GetRowORD(data_plt, row);
						break;
					// As number of fields in MELT and QPLT
					// are identical, a further check must
					// be performed
					case number_of_fields::QPLT:
						if (CheckQPLT(row.data)) {
							GetRowORD(data_plt, row);
							qpltMELTCheck |= (1 << 1);
						} else {
							GetRowORD(data_elt, row);
							qpltMELTCheck |= 1;
						}
						if (qpltMELTCheck == qpltMELTMask) {
							fprintf(stderr,
								"FATAL: Cannot combine QPLT and MELT files\n");
							exit(EXIT_FAILURE);
						}
						break;
					case number_of_fields::LegacyELT:
						GetRowLegacy(data_elt, row);
						legacyFiles = true;
						break;
					case number_of_fields::LegacyPLT1:
					case number_of_fields::LegacyPLT2:
						GetRowLegacy(data_plt, row);
						legacyFiles = true;
						break;
					default:
						fprintf(stderr,
							"FATAL: Unknown file format:\n%s",
							row.data);
						exit(EXIT_FAILURE);
				}

				break;

			} while (true);

		}

		void (*GetELTRow)(std::map<int, fin_data>&, const fin_data&);
		void (*GetPLTRow)(std::map<period_event, fin_data>&, const fin_data&);
		if (legacyFiles) {
			GetELTRow = &GetRowLegacy;
			GetPLTRow = &GetRowLegacy;
		} else {
			GetELTRow = &GetRowORD;
			GetPLTRow = &GetRowORD;
		}
		// First entry should always have lowest event ID
		// Only one of data_elt and data_plt will actually have entries
		// so exploit this with a single check
		if (data_elt.size() > 0) WriteAndReadRows(data_elt, GetELTRow);
		else if (data_plt.size() > 0) WriteAndReadRows(data_plt, GetPLTRow);

	}